

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_1::QueryRobustAccessCase::iterate(QueryRobustAccessCase *this)

{
  deUint32 err;
  MessageBuilder *pMVar1;
  GLboolean *extraout_RDX;
  GLdouble *pGVar2;
  GLenum GVar3;
  MessageBuilder local_1db0;
  undefined1 local_1c29 [8];
  deUint8 robustAccessGL;
  Functions gl;
  undefined1 local_1f8 [8];
  RenderingContext context;
  EGLint attribList [7];
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  QueryRobustAccessCase *this_local;
  
  log = (TestLog *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1a0,
                      (char (*) [122])
                      "Check that after successfully creating a robust context the robust access query returned by glBooleanv() equals GL_TRUE\n\n"
                     );
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  context.m_context = (EGLContext)0x300003098;
  RobustnessTestCase::checkRequiredEGLExtensions
            (&this->super_RobustnessTestCase,(EGLint *)&context.m_context);
  gl.waitSync = (glWaitSyncFunc)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_1f8,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,
             (EGLint *)&context.m_context,&(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&gl.waitSync);
  RenderingContext::makeCurrent
            ((RenderingContext *)local_1f8,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions((Functions *)(local_1c29 + 1));
  RenderingContext::initGLFunctions((RenderingContext *)local_1f8,(Functions *)(local_1c29 + 1));
  checkRequiredGLRobustnessExtension((EGLint *)&context.m_context,(Functions *)(local_1c29 + 1));
  GVar3 = 0x90f3;
  pGVar2 = (GLdouble *)local_1c29;
  (*gl.getBooleani_v)(0x90f3,(GLuint)pGVar2,extraout_RDX);
  err = (*gl.getDoublev)(GVar3,pGVar2);
  glu::checkError(err,"glGetBooleanv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x58a);
  if (local_1c29[0] == '\x01') {
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestLog::operator<<(&local_1db0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_1db0,
                        (char (*) [68])
                        "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got \'");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c29);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [20])"\' expected GL_TRUE.");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1db0);
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  this_local._4_4_ = STOP;
  RenderingContext::~RenderingContext((RenderingContext *)local_1f8);
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check that after successfully creating a robust context the robust access query returned by glBooleanv() equals GL_TRUE\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		deUint8 robustAccessGL;
		gl.getBooleanv(GL_CONTEXT_ROBUST_ACCESS_EXT, &robustAccessGL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv()");

		if (robustAccessGL != GL_TRUE)
		{
			log << TestLog::Message
				<< "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got '" << robustAccessGL << "' expected GL_TRUE."
				<< TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}